

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqldriver.cpp
# Opt level: O1

QString * __thiscall
QSqlDriver::sqlStatement
          (QString *__return_storage_ptr__,QSqlDriver *this,StatementType type,QString *tableName,
          QSqlRecord *rec,bool preparedStatement)

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  undefined8 uVar4;
  char cVar5;
  bool bVar6;
  QChar QVar7;
  int iVar8;
  qsizetype qVar9;
  QString *pQVar10;
  char *pcVar11;
  QArrayData *pQVar12;
  long lVar13;
  long in_FS_OFFSET;
  QLatin1String QVar14;
  QLatin1String QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QLatin1String QVar18;
  QLatin1String QVar19;
  QLatin1String QVar20;
  QLatin1String QVar21;
  QLatin1String QVar22;
  QString local_c0;
  QString local_a8;
  QString local_88;
  undefined1 local_68 [16];
  char *local_58;
  QString *local_50;
  QExplicitlySharedDataPointer<QSqlFieldPrivate> local_48;
  QString *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88.d.size = -0x5555555555555556;
  local_88.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_88.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  if ((tableName->d).size == 0) {
    local_88.d.d = (Data *)0x0;
    local_88.d.ptr = (char16_t *)0x0;
    local_88.d.size = 0;
  }
  else {
    prepareIdentifier(&local_88,tableName,TableName,this);
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QString::reallocData((longlong)__return_storage_ptr__,0x80);
  pDVar2 = (__return_storage_ptr__->d).d;
  if ((pDVar2 != (Data *)0x0) && ((pDVar2->super_QArrayData).alloc != 0)) {
    pAVar1 = &(pDVar2->super_QArrayData).flags;
    *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  switch(type) {
  case WhereStatement:
    local_a8.d.size = -0x5555555555555556;
    local_a8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_a8.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    if (local_88.d.size == 0) {
      local_a8.d.d = (Data *)0x0;
      local_a8.d.ptr = (char16_t *)0x0;
      local_a8.d.size = 0;
    }
    else {
      local_68._0_8_ = &local_88;
      local_68._8_2_ = 0x2e;
      QStringBuilder<const_QString_&,_char16_t>::convertTo<QString>
                (&local_a8,(QStringBuilder<const_QString_&,_char16_t> *)local_68);
    }
    iVar8 = QSqlRecord::count(rec);
    if (0 < iVar8) {
      lVar13 = 0;
      do {
        iVar8 = (int)lVar13;
        bVar6 = QSqlRecord::isGenerated(rec,iVar8);
        if (bVar6) {
          QVar20.m_data = (char *)((ulong)((__return_storage_ptr__->d).size == 0) + 5);
          QVar20.m_size = (qsizetype)__return_storage_ptr__;
          QString::append(QVar20);
          QString::append(__return_storage_ptr__);
          QSqlRecord::fieldName(&local_c0,rec,iVar8);
          prepareIdentifier((QString *)local_68,&local_c0,FieldName,this);
          QString::append(__return_storage_ptr__);
          uVar4 = local_68._0_8_;
          if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_68._0_8_ = *(int *)local_68._0_8_ + -1;
            UNLOCK();
            if (*(int *)uVar4 == 0) {
              QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
            }
          }
          if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,0x10);
            }
          }
          bVar6 = QSqlRecord::isNull(rec,iVar8);
          if (bVar6) {
            pcVar11 = (char *)0x8;
          }
          else {
            if (!preparedStatement) {
              QVar22.m_data = (char *)0x3;
              QVar22.m_size = (qsizetype)__return_storage_ptr__;
              pQVar10 = (QString *)QString::append(QVar22);
              QSqlRecord::field((QSqlField *)local_68,rec,iVar8);
              (**(code **)(*(long *)this + 0x98))(&local_c0,this,local_68,0);
              QString::append(pQVar10);
              if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,0x10);
                }
              }
              QSqlField::~QSqlField((QSqlField *)local_68);
              goto LAB_0011f1bb;
            }
            pcVar11 = (char *)0x4;
          }
          QVar21.m_data = pcVar11;
          QVar21.m_size = (qsizetype)__return_storage_ptr__;
          QString::append(QVar21);
        }
LAB_0011f1bb:
        lVar13 = lVar13 + 1;
        iVar8 = QSqlRecord::count(rec);
      } while (lVar13 < iVar8);
    }
    break;
  case SelectStatement:
    iVar8 = QSqlRecord::count(rec);
    if (0 < iVar8) {
      lVar13 = 0;
      do {
        bVar6 = QSqlRecord::isGenerated(rec,(int)lVar13);
        if (bVar6) {
          QSqlRecord::fieldName(&local_a8,rec,(int)lVar13);
          prepareIdentifier((QString *)local_68,&local_a8,FieldName,this);
          qVar9 = QString::append(__return_storage_ptr__);
          QVar19.m_data = (char *)0x2;
          QVar19.m_size = qVar9;
          QString::append(QVar19);
          if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_68._0_8_ = *(int *)local_68._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_68._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
            }
          }
          if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        lVar13 = lVar13 + 1;
        iVar8 = QSqlRecord::count(rec);
      } while (lVar13 < iVar8);
    }
    if ((__return_storage_ptr__->d).size == 0) goto switchD_0011e960_default;
    QString::chop((longlong)__return_storage_ptr__);
    local_68._0_8_ = (QArrayData *)0x7;
    local_68._8_8_ = "SELECT ";
    local_50 = (QString *)0x6;
    local_48.d.ptr = (totally_ordered_wrapper<QSqlFieldPrivate_*>)((long)"DELETE FROM " + 6);
    local_40 = &local_88;
    local_58 = (char *)__return_storage_ptr__;
    QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_const_QString_&>
    ::convertTo<QString>
              (&local_a8,
               (QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_const_QString_&>
                *)local_68);
    goto LAB_0011ef76;
  case UpdateStatement:
    local_68._8_8_ = (char *)0x7;
    local_58 = "UPDATE ";
    local_50 = &local_88;
    local_48.d.ptr = (totally_ordered_wrapper<QSqlFieldPrivate_*>)(QSqlFieldPrivate *)0x5;
    local_40 = (QString *)0x14078f;
    local_68._0_8_ = __return_storage_ptr__;
    QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_QLatin1String>,_const_QString_&>,_QLatin1String>
    ::convertTo<QString>
              (&local_a8,
               (QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_QLatin1String>,_const_QString_&>,_QLatin1String>
                *)local_68);
    pQVar12 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar3 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_a8.d.d;
    (__return_storage_ptr__->d).ptr = local_a8.d.ptr;
    qVar9 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_a8.d.size;
    local_a8.d.d = (Data *)pQVar12;
    local_a8.d.ptr = pcVar3;
    local_a8.d.size = qVar9;
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar12,2,0x10);
      }
    }
    iVar8 = QSqlRecord::count(rec);
    if (0 < iVar8) {
      lVar13 = 0;
      do {
        iVar8 = (int)lVar13;
        bVar6 = QSqlRecord::isGenerated(rec,iVar8);
        if (bVar6) {
          QSqlRecord::fieldName(&local_a8,rec,iVar8);
          prepareIdentifier((QString *)local_68,&local_a8,FieldName,this);
          QVar7.ucs = QString::append(__return_storage_ptr__);
          QString::append(QVar7);
          if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_68._0_8_ = *(int *)local_68._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_68._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
            }
          }
          if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (preparedStatement) {
            QString::append((QChar)(char16_t)__return_storage_ptr__);
          }
          else {
            QSqlRecord::field((QSqlField *)local_68,rec,iVar8);
            (**(code **)(*(long *)this + 0x98))(&local_a8,this,(QSqlField *)local_68,0);
            QString::append(__return_storage_ptr__);
            if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
              }
            }
            QSqlField::~QSqlField((QSqlField *)local_68);
          }
          QVar14.m_data = (char *)0x2;
          QVar14.m_size = (qsizetype)__return_storage_ptr__;
          QString::append(QVar14);
        }
        lVar13 = lVar13 + 1;
        iVar8 = QSqlRecord::count(rec);
      } while (lVar13 < iVar8);
    }
    QVar15.m_data = (char *)0x2;
    QVar15.m_size = (qsizetype)__return_storage_ptr__;
    cVar5 = QString::endsWith(QVar15,0x14075d);
    if (cVar5 != '\0') {
      QString::chop((longlong)__return_storage_ptr__);
      goto switchD_0011e960_default;
    }
    if ((__return_storage_ptr__->d).ptr == (char16_t *)0x0) goto switchD_0011e960_default;
    pQVar12 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    if (pQVar12 == (QArrayData *)0x0) goto switchD_0011e960_default;
    LOCK();
    (((QArrayData *)&pQVar12->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&pQVar12->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QArrayData *)&pQVar12->ref_)->ref_)._q_value.super___atomic_base<int>._M_i != 0)
    goto switchD_0011e960_default;
    goto LAB_0011f1e5;
  case InsertStatement:
    local_68._8_8_ = (char *)0xc;
    local_58 = "INSERT INTO ";
    local_50 = &local_88;
    local_48.d.ptr = (totally_ordered_wrapper<QSqlFieldPrivate_*>)(QSqlFieldPrivate *)0x2;
    local_40 = (QString *)0x1407b5;
    local_68._0_8_ = __return_storage_ptr__;
    QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_QLatin1String>,_const_QString_&>,_QLatin1String>
    ::convertTo<QString>
              (&local_a8,
               (QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_QLatin1String>,_const_QString_&>,_QLatin1String>
                *)local_68);
    pQVar12 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar3 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_a8.d.d;
    (__return_storage_ptr__->d).ptr = local_a8.d.ptr;
    qVar9 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_a8.d.size;
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        local_a8.d.d = (Data *)pQVar12;
        local_a8.d.ptr = pcVar3;
        local_a8.d.size = qVar9;
        QArrayData::deallocate(pQVar12,2,0x10);
      }
    }
    local_a8.d.d = (Data *)0x0;
    local_a8.d.ptr = (char16_t *)0x0;
    local_a8.d.size = 0;
    iVar8 = QSqlRecord::count(rec);
    if (0 < iVar8) {
      lVar13 = 0;
      do {
        iVar8 = (int)lVar13;
        bVar6 = QSqlRecord::isGenerated(rec,iVar8);
        if (bVar6) {
          QSqlRecord::fieldName(&local_c0,rec,iVar8);
          prepareIdentifier((QString *)local_68,&local_c0,FieldName,this);
          qVar9 = QString::append(__return_storage_ptr__);
          QVar16.m_data = (char *)0x2;
          QVar16.m_size = qVar9;
          QString::append(QVar16);
          if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_68._0_8_ = *(int *)local_68._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_68._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
            }
          }
          if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (preparedStatement) {
            QString::append((QChar)(char16_t)&local_a8);
          }
          else {
            QSqlRecord::field((QSqlField *)local_68,rec,iVar8);
            (**(code **)(*(long *)this + 0x98))(&local_c0,this,(QSqlField *)local_68,0);
            QString::append(&local_a8);
            if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,0x10);
              }
            }
            QSqlField::~QSqlField((QSqlField *)local_68);
          }
          QVar17.m_data = (char *)0x2;
          QVar17.m_size = (qsizetype)&local_a8;
          QString::append(QVar17);
        }
        lVar13 = lVar13 + 1;
        iVar8 = QSqlRecord::count(rec);
      } while (lVar13 < iVar8);
    }
    if (local_a8.d.size == 0) {
      if ((__return_storage_ptr__->d).ptr != (char16_t *)0x0) {
        pQVar12 = &((__return_storage_ptr__->d).d)->super_QArrayData;
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        if (pQVar12 != (QArrayData *)0x0) {
          LOCK();
          (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar12,2,0x10);
          }
        }
      }
    }
    else {
      QString::chop((longlong)&local_a8);
      pDVar2 = (__return_storage_ptr__->d).d;
      lVar13 = (__return_storage_ptr__->d).size;
      if ((pDVar2 == (Data *)0x0) ||
         (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QString::reallocData((longlong)__return_storage_ptr__,(AllocationOption)lVar13);
      }
      (__return_storage_ptr__->d).ptr[lVar13 + -2] = L')';
      QVar18.m_data = (char *)0x8;
      QVar18.m_size = (qsizetype)__return_storage_ptr__;
      pQVar10 = (QString *)QString::append(QVar18);
      QVar7.ucs = QString::append(pQVar10);
      QString::append(QVar7);
    }
    break;
  case DeleteStatement:
    local_68._8_8_ = (char *)0xc;
    local_58 = "DELETE FROM ";
    local_50 = &local_88;
    local_68._0_8_ = __return_storage_ptr__;
    QStringBuilder<QStringBuilder<QString_&,_QLatin1String>,_const_QString_&>::convertTo<QString>
              (&local_a8,
               (QStringBuilder<QStringBuilder<QString_&,_QLatin1String>,_const_QString_&> *)local_68
              );
LAB_0011ef76:
    pQVar12 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar3 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_a8.d.d;
    (__return_storage_ptr__->d).ptr = local_a8.d.ptr;
    qVar9 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_a8.d.size;
    local_a8.d.d = (Data *)pQVar12;
    local_a8.d.ptr = pcVar3;
    local_a8.d.size = qVar9;
    break;
  default:
    goto switchD_0011e960_default;
  }
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    pQVar12 = &(local_a8.d.d)->super_QArrayData;
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
LAB_0011f1e5:
      QArrayData::deallocate(pQVar12,2,0x10);
    }
  }
switchD_0011e960_default:
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QSqlDriver::sqlStatement(StatementType type, const QString &tableName,
                                 const QSqlRecord &rec, bool preparedStatement) const
{
    const auto tableNameString = tableName.isEmpty() ? QString()
                                    : prepareIdentifier(tableName, QSqlDriver::TableName, this);
    QString s;
    s.reserve(128);
    switch (type) {
    case SelectStatement:
        for (qsizetype i = 0; i < rec.count(); ++i) {
            if (rec.isGenerated(i))
                s.append(prepareIdentifier(rec.fieldName(i), QSqlDriver::FieldName, this)).append(", "_L1);
        }
        if (s.isEmpty())
            return s;
        s.chop(2);
        s = "SELECT "_L1 + s + " FROM "_L1 + tableNameString;
        break;
    case WhereStatement:
    {
        const QString tableNamePrefix = tableNameString.isEmpty()
                                            ? QString() : tableNameString + u'.';
        for (qsizetype i = 0; i < rec.count(); ++i) {
            if (!rec.isGenerated(i))
                continue;
            s.append(s.isEmpty() ? "WHERE "_L1 : " AND "_L1);
            s.append(tableNamePrefix);
            s.append(prepareIdentifier(rec.fieldName(i), QSqlDriver::FieldName, this));
            if (rec.isNull(i))
                s.append(" IS NULL"_L1);
            else if (preparedStatement)
                s.append(" = ?"_L1);
            else
                s.append(" = "_L1).append(formatValue(rec.field(i)));
        }
        break;
    }
    case UpdateStatement:
        s = s + "UPDATE "_L1 + tableNameString + " SET "_L1;
        for (qsizetype i = 0; i < rec.count(); ++i) {
            if (!rec.isGenerated(i))
                continue;
            s.append(prepareIdentifier(rec.fieldName(i), QSqlDriver::FieldName, this)).append(u'=');
            if (preparedStatement)
                s.append(u'?');
            else
                s.append(formatValue(rec.field(i)));
            s.append(", "_L1);
        }
        if (s.endsWith(", "_L1))
            s.chop(2);
        else
            s.clear();
        break;
    case DeleteStatement:
        s = s + "DELETE FROM "_L1 + tableNameString;
        break;
    case InsertStatement: {
        s = s + "INSERT INTO "_L1 + tableNameString + " ("_L1;
        QString vals;
        for (qsizetype i = 0; i < rec.count(); ++i) {
            if (!rec.isGenerated(i))
                continue;
            s.append(prepareIdentifier(rec.fieldName(i), QSqlDriver::FieldName, this)).append(", "_L1);
            if (preparedStatement)
                vals.append(u'?');
            else
                vals.append(formatValue(rec.field(i)));
            vals.append(", "_L1);
        }
        if (vals.isEmpty()) {
            s.clear();
        } else {
            vals.chop(2); // remove trailing comma
            s[s.size() - 2] = u')';
            s.append("VALUES ("_L1).append(vals).append(u')');
        }
        break; }
    }
    return s;
}